

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token&,slang::syntax::StatementSyntax&,slang::syntax::ElseClauseSyntax*&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ConditionalPredicateSyntax *args_5,Token *args_6,StatementSyntax *args_7,
          ElseClauseSyntax **args_8)

{
  Token ifKeyword;
  Token openParen;
  Token closeParen;
  ConditionalStatementSyntax *this_00;
  ElseClauseSyntax *in_RCX;
  StatementSyntax *in_R8;
  Info *in_R9;
  Token *in_stack_00000010;
  ConditionalPredicateSyntax *in_stack_00000018;
  undefined8 *in_stack_00000020;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  NamedLabelSyntax *in_stack_ffffffffffffff68;
  
  this_00 = (ConditionalStatementSyntax *)
            allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ifKeyword.info = *(Info **)&in_R8->super_SyntaxNode;
  ifKeyword._0_8_ = in_R9->location;
  openParen.info = *(Info **)&in_RCX->super_SyntaxNode;
  openParen._0_8_ = (in_R8->super_SyntaxNode).parent;
  closeParen.info = in_R9;
  closeParen._0_8_ = (in_RCX->super_SyntaxNode).parent;
  slang::syntax::ConditionalStatementSyntax::ConditionalStatementSyntax
            (this_00,in_stack_ffffffffffffff68,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000020,
             *in_stack_00000010,ifKeyword,openParen,in_stack_00000018,closeParen,in_R8,in_RCX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }